

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::LinkedModel::_InternalSerialize
          (LinkedModel *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint value;
  LinkedModelFile *this_00;
  ulong uVar1;
  void *data;
  uint8_t *puVar2;
  undefined8 *puVar3;
  size_t __n;
  
  if (this->_oneof_case_[0] == 1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->LinkType_).linkedmodelfile_;
    *target = '\n';
    value = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)value;
    if (value < 0x80) {
      puVar2 = target + 2;
    }
    else {
      puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (value,target + 1);
    }
    target = LinkedModelFile::_InternalSerialize(this_00,puVar2,stream);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    data = *(void **)((uVar1 & 0xfffffffffffffffc) + 8);
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar1 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar3[1],target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* LinkedModel::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.LinkedModel)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.LinkedModelFile linkedModelFile = 1;
  if (_internal_has_linkedmodelfile()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::linkedmodelfile(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.LinkedModel)
  return target;
}